

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cc
# Opt level: O0

Value * __thiscall flow::IRBuilder::createNot(IRBuilder *this,Value *rhs,string *name)

{
  LiteralType LVar1;
  ulong uVar2;
  ConstantValue<long,_(flow::LiteralType)2> *local_78;
  string local_50;
  ConstantValue<long,_(flow::LiteralType)2> *local_30;
  ConstantInt *a;
  string *name_local;
  Value *rhs_local;
  IRBuilder *this_local;
  
  a = (ConstantInt *)name;
  name_local = (string *)rhs;
  rhs_local = (Value *)this;
  LVar1 = Value::type(rhs);
  if (LVar1 == Number) {
    if (name_local == (string *)0x0) {
      local_78 = (ConstantValue<long,_(flow::LiteralType)2> *)0x0;
    }
    else {
      local_78 = (ConstantValue<long,_(flow::LiteralType)2> *)
                 __dynamic_cast(name_local,&Value::typeinfo,
                                &ConstantValue<long,(flow::LiteralType)2>::typeinfo,0);
    }
    local_30 = local_78;
    if (local_78 == (ConstantValue<long,_(flow::LiteralType)2> *)0x0) {
      makeName(&local_50,this,(string *)a);
      this_local = (IRBuilder *)
                   insert<flow::UnaryInstr<(flow::UnaryOperator)1,(flow::LiteralType)2>,flow::Value*&,std::__cxx11::string>
                             (this,(Value **)&name_local,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      uVar2 = ConstantValue<long,_(flow::LiteralType)2>::get(local_78);
      this_local = (IRBuilder *)get(this,uVar2 ^ 0xffffffffffffffff);
    }
    return (Value *)this_local;
  }
  __assert_fail("rhs->type() == LiteralType::Number",
                "/workspace/llm4binary/github/license_all_cmakelists_25/christianparpart[P]flow/src/flow/ir/IRBuilder.cc"
                ,0xb2,"Value *flow::IRBuilder::createNot(Value *, const std::string &)");
}

Assistant:

Value* IRBuilder::createNot(Value* rhs, const std::string& name) {
  assert(rhs->type() == LiteralType::Number);

  if (auto a = dynamic_cast<ConstantInt*>(rhs))
    return get(~a->get());

  return insert<INotInstr>(rhs, makeName(name));
}